

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg.h
# Opt level: O1

bool absl::lts_20240722::str_format_internal::FormatArgImpl::
     Dispatch<std::basic_string_view<wchar_t,std::char_traits<wchar_t>>>
               (Data arg,FormatConversionSpecImpl spec,void *out)

{
  bool bVar1;
  uint uVar2;
  FormatSinkImpl *in_R9;
  FormatConversionSpecImpl conv;
  
  uVar2 = spec.precision_;
  if ((spec.conv_ != 0x13) && ((2L << (spec.conv_ & 0x3f) & 0x80004U) != 0)) {
    conv.width_ = 0;
    conv.conv_ = (char)uVar2;
    conv.flags_ = (char)(uVar2 >> 8);
    conv.length_mod_ = (char)(uVar2 >> 0x10);
    conv._3_1_ = (char)(uVar2 >> 0x18);
    conv.precision_ = (int)out;
    bVar1 = anon_unknown_53::ConvertStringArg
                      (*(anon_unknown_53 **)((long)arg.ptr + 8),*arg.ptr,spec._0_8_,conv,in_R9);
    return bVar1;
  }
  return false;
}

Assistant:

static bool Dispatch(Data arg, FormatConversionSpecImpl spec, void* out) {
    // A `none` conv indicates that we want the `int` conversion.
    if (ABSL_PREDICT_FALSE(spec.conversion_char() ==
                           FormatConversionCharInternal::kNone)) {
      return ToInt<T>(arg, static_cast<int*>(out), std::is_integral<T>(),
                      std::is_enum<T>());
    }
    if (ABSL_PREDICT_FALSE(!Contains(ArgumentToConv<T>(),
                                     spec.conversion_char()))) {
      return false;
    }
    return str_format_internal::FormatConvertImpl(
               Manager<T>::Value(arg), spec,
               static_cast<FormatSinkImpl*>(out))
        .value;
  }